

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text,size_t len)

{
  char *pcVar1;
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream oss;
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t len_local;
  char *text_local;
  CommentInfo *this_local;
  
  local_20 = len;
  len_local = (size_t)text;
  text_local = (char *)this;
  if (this->comment_ != (char *)0x0) {
    releaseStringValue(this->comment_,0);
    this->comment_ = (char *)0x0;
  }
  if (len_local == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"assert json failed",&local_41);
    throwLogicError(&local_40);
  }
  if ((*(char *)len_local != '\0') && (*(char *)len_local != '/')) {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"in Json::Value::setComment(): Comments must start with /")
    ;
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1f0);
  }
  pcVar1 = duplicateStringValue((char *)len_local,local_20);
  this->comment_ = pcVar1;
  return;
}

Assistant:

void Value::CommentInfo::setComment(const char* text, size_t len) {
  if (comment_) {
    releaseStringValue(comment_, 0u);
    comment_ = 0;
  }
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text, len);
}